

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataController.cpp
# Opt level: O2

void __thiscall Rml::DataControllers::Add(DataControllers *this,DataControllerPtr *controller)

{
  ObserverPtrBlock *pOVar1;
  code *pcVar2;
  bool bVar3;
  Element *in_RAX;
  DataController *pDVar4;
  Element *element;
  
  pDVar4 = (controller->_M_t).
           super___uniq_ptr_impl<Rml::DataController,_Rml::Releaser<Rml::DataController>_>._M_t.
           super__Tuple_impl<0UL,_Rml::DataController_*,_Rml::Releaser<Rml::DataController>_>.
           super__Head_base<0UL,_Rml::DataController_*,_false>._M_head_impl;
  element = in_RAX;
  if (pDVar4 == (DataController *)0x0) {
    bVar3 = Assert("RMLUI_ASSERT(controller)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataController.cpp"
                   ,0x36);
    if (!bVar3) goto LAB_0025eea7;
    pDVar4 = (controller->_M_t).
             super___uniq_ptr_impl<Rml::DataController,_Rml::Releaser<Rml::DataController>_>._M_t.
             super__Tuple_impl<0UL,_Rml::DataController_*,_Rml::Releaser<Rml::DataController>_>.
             super__Head_base<0UL,_Rml::DataController_*,_false>._M_head_impl;
  }
  pOVar1 = (pDVar4->attached_element).block;
  if ((pOVar1 == (ObserverPtrBlock *)0x0) ||
     (element = (Element *)pOVar1->pointed_to_object, element == (Element *)0x0)) {
    bVar3 = Assert("Invalid controller, make sure it is valid before adding",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataController.cpp"
                   ,0x39);
    if (!bVar3) {
LAB_0025eea7:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
  }
  else {
    ::std::
    _Hashtable<Rml::Element*,std::pair<Rml::Element*const,std::unique_ptr<Rml::DataController,Rml::Releaser<Rml::DataController>>>,std::allocator<std::pair<Rml::Element*const,std::unique_ptr<Rml::DataController,Rml::Releaser<Rml::DataController>>>>,std::__detail::_Select1st,std::equal_to<Rml::Element*>,std::hash<Rml::Element*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
    ::
    _M_emplace<Rml::Element*&,std::unique_ptr<Rml::DataController,Rml::Releaser<Rml::DataController>>>
              ((_Hashtable<Rml::Element*,std::pair<Rml::Element*const,std::unique_ptr<Rml::DataController,Rml::Releaser<Rml::DataController>>>,std::allocator<std::pair<Rml::Element*const,std::unique_ptr<Rml::DataController,Rml::Releaser<Rml::DataController>>>>,std::__detail::_Select1st,std::equal_to<Rml::Element*>,std::hash<Rml::Element*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                *)this,&element,controller);
  }
  return;
}

Assistant:

void DataControllers::Add(DataControllerPtr controller)
{
	RMLUI_ASSERT(controller);

	Element* element = controller->GetElement();
	RMLUI_ASSERTMSG(element, "Invalid controller, make sure it is valid before adding");
	if (!element)
		return;

	controllers.emplace(element, std::move(controller));
}